

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

Variable __thiscall LiteScript::_Type_ARRAY::OArray(_Type_ARRAY *this,Variable *obj1,Variable *obj2)

{
  void *pvVar1;
  char *name;
  bool bVar2;
  Object *pOVar3;
  Type *pTVar4;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar6;
  string local_40;
  uint *puVar5;
  
  pOVar3 = Variable::operator->(in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar2 = Type::operator==(pTVar4,(Type *)_type_number);
  if (bVar2) {
    pOVar3 = Variable::operator->(obj2);
    pvVar1 = pOVar3->data;
    pOVar3 = Variable::operator->(in_RCX);
    Number::operator_cast_to_int((Number *)pOVar3->data);
    VVar6 = Array::operator[]((Array *)this,(uint)pvVar1);
    puVar5 = VVar6.nb_ref;
  }
  else {
    pOVar3 = Variable::operator->(in_RCX);
    pTVar4 = Object::GetType(pOVar3);
    bVar2 = Type::operator==(pTVar4,(Type *)_type_string);
    pOVar3 = Variable::operator->(obj2);
    if (bVar2) {
      name = (char *)pOVar3->data;
      pOVar3 = Variable::operator->(in_RCX);
      String::operator_cast_to_string(&local_40,(String *)pOVar3->data);
      VVar6 = Array::operator[]((Array *)this,name);
      puVar5 = VVar6.nb_ref;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
        puVar5 = extraout_RDX;
      }
    }
    else {
      VVar6 = Memory::Create((Memory *)this,(Type *)pOVar3->memory);
      puVar5 = VVar6.nb_ref;
    }
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_ARRAY::OArray(Variable &obj1, const Variable &obj2) const {
    if (obj2->GetType() == Type::NUMBER)
        return obj1->GetData<Array>()[(unsigned int)(int)obj2->GetData<Number>()];
    else if (obj2->GetType() == Type::STRING)
        return obj1->GetData<Array>()[((std::string)(obj2->GetData<String>())).c_str()];
    else
        return obj1->memory.Create(Type::UNDEFINED);
}